

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqc.c
# Opt level: O3

void opj_mqc_byteout(opj_mqc_t *mqc)

{
  OPJ_BYTE *pOVar1;
  OPJ_BYTE OVar2;
  uint uVar3;
  OPJ_UINT32 OVar4;
  
  pOVar1 = mqc->bp;
  if (pOVar1 < mqc->start + -1) {
    __assert_fail("mqc->bp >= mqc->start - 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/mqc.c"
                  ,0xbd,"void opj_mqc_byteout(opj_mqc_t *)");
  }
  if (*pOVar1 == 0xff) {
    pOVar1 = pOVar1 + 1;
    mqc->bp = pOVar1;
    uVar3 = mqc->c;
LAB_00120c59:
    OVar2 = (OPJ_BYTE)(uVar3 >> 0x14);
    OVar4 = 7;
    uVar3 = 0xfffff;
  }
  else {
    uVar3 = mqc->c;
    if ((uVar3 >> 0x1b & 1) == 0) {
      pOVar1 = pOVar1 + 1;
      mqc->bp = pOVar1;
    }
    else {
      *pOVar1 = *pOVar1 + '\x01';
      pOVar1 = mqc->bp;
      if (*pOVar1 == 0xff) {
        uVar3 = mqc->c & 0x7ffffff;
        mqc->c = uVar3;
        pOVar1 = pOVar1 + 1;
        mqc->bp = pOVar1;
        goto LAB_00120c59;
      }
      pOVar1 = pOVar1 + 1;
      mqc->bp = pOVar1;
      uVar3 = mqc->c;
    }
    OVar2 = (OPJ_BYTE)(uVar3 >> 0x13);
    OVar4 = 8;
    uVar3 = 0x7ffff;
  }
  *pOVar1 = OVar2;
  mqc->c = mqc->c & uVar3;
  mqc->ct = OVar4;
  return;
}

Assistant:

static void opj_mqc_byteout(opj_mqc_t *mqc)
{
    /* bp is initialized to start - 1 in opj_mqc_init_enc() */
    /* but this is safe, see opj_tcd_code_block_enc_allocate_data() */
    assert(mqc->bp >= mqc->start - 1);
    if (*mqc->bp == 0xff) {
        mqc->bp++;
        *mqc->bp = (OPJ_BYTE)(mqc->c >> 20);
        mqc->c &= 0xfffff;
        mqc->ct = 7;
    } else {
        if ((mqc->c & 0x8000000) == 0) {
            mqc->bp++;
            *mqc->bp = (OPJ_BYTE)(mqc->c >> 19);
            mqc->c &= 0x7ffff;
            mqc->ct = 8;
        } else {
            (*mqc->bp)++;
            if (*mqc->bp == 0xff) {
                mqc->c &= 0x7ffffff;
                mqc->bp++;
                *mqc->bp = (OPJ_BYTE)(mqc->c >> 20);
                mqc->c &= 0xfffff;
                mqc->ct = 7;
            } else {
                mqc->bp++;
                *mqc->bp = (OPJ_BYTE)(mqc->c >> 19);
                mqc->c &= 0x7ffff;
                mqc->ct = 8;
            }
        }
    }
}